

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::fulfill
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this,
          anon_struct_128_5_975a5653_for_value *value)

{
  anon_struct_128_5_975a5653_for_value *value_00;
  ExceptionOr<siginfo_t> local_238;
  anon_struct_128_5_975a5653_for_value *local_18;
  anon_struct_128_5_975a5653_for_value *value_local;
  AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (anon_struct_128_5_975a5653_for_value *)this;
    value_00 = mv<siginfo_t>(value);
    ExceptionOr<siginfo_t>::ExceptionOr(&local_238,value_00);
    ExceptionOr<siginfo_t>::operator=(&this->result,&local_238);
    ExceptionOr<siginfo_t>::~ExceptionOr(&local_238);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }